

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Reader::readValue(Reader *this)

{
  ValueHolder VVar1;
  Location pCVar2;
  _Elt_pointer ppVVar3;
  Location pCVar4;
  ValueHolder VVar5;
  ValueHolder VVar6;
  bool bVar7;
  ushort uVar8;
  ulong uVar9;
  _Elt_pointer ppVVar10;
  undefined8 uVar11;
  ValueHolder *pVVar12;
  ushort uVar13;
  pointer pcVar14;
  _Elt_pointer ppVVar15;
  ValueHolder *pVVar16;
  ushort uVar17;
  pointer unaff_R12;
  Token token;
  Token local_f8;
  ValueHolder local_e0;
  ushort local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  ValueHolder local_b8;
  ushort local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  string local_90;
  ValueHolder local_70;
  ushort local_68;
  undefined8 local_60;
  ValueHolder VStack_58;
  ValueHolder local_50;
  ValueHolder local_48;
  ushort local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  skipCommentTokens(this,&local_f8);
  if ((this->collectComments_ == true) && ((this->commentsBefore_)._M_string_length != 0)) {
    uVar9 = std::__cxx11::string::find_last_not_of
                      ((char *)&this->commentsBefore_,0x11a5fe,0xffffffffffffffff);
    if (uVar9 == 0xffffffffffffffff) {
      (this->commentsBefore_)._M_string_length = 0;
      pcVar14 = (this->commentsBefore_)._M_dataplus._M_p;
    }
    else {
      if ((this->commentsBefore_)._M_string_length <= uVar9) {
        uVar11 = std::__throw_out_of_range_fmt
                           ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                            "basic_string::erase");
        if (local_90._M_dataplus._M_p != unaff_R12) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        _Unwind_Resume(uVar11);
      }
      (this->commentsBefore_)._M_string_length = uVar9 + 1;
      pcVar14 = (this->commentsBefore_)._M_dataplus._M_p + uVar9 + 1;
    }
    *pcVar14 = '\0';
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar10 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setComment(ppVVar10[-1],(this->commentsBefore_)._M_dataplus._M_p,commentBefore);
    std::__cxx11::string::_M_replace
              ((ulong)&this->commentsBefore_,0,(char *)(this->commentsBefore_)._M_string_length,
               0x11adae);
  }
  switch(local_f8.type_) {
  case tokenObjectBegin:
    bVar7 = readObject(this,&local_f8);
    break;
  default:
switchD_0010df5b_caseD_2:
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar15 = ppVVar10;
    if (ppVVar10 == ppVVar3) {
      ppVVar15 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar4 = this->begin_;
    ppVVar15[-1]->start_ = (long)local_f8.start_ - (long)pCVar4;
    if (ppVVar10 == ppVVar3) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar10[-1]->limit_ = (long)local_f8.end_ - (long)pCVar4;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Syntax error: value, object or array expected.","");
    addError(this,&local_90,&local_f8,(Location)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    return false;
  case tokenArrayBegin:
    bVar7 = readArray(this,&local_f8);
    break;
  case tokenString:
    bVar7 = decodeString(this,&local_f8);
    goto LAB_0010e371;
  case tokenNumber:
    bVar7 = decodeNumber(this,&local_f8);
    goto LAB_0010e371;
  case tokenTrue:
    uVar8 = local_b0 & 0xfe00;
    local_b0 = uVar8 | 5;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    local_b8.bool_ = true;
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar10 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar12 = &ppVVar10[-1]->value_;
    uVar13 = *(ushort *)(pVVar12 + 1);
    uVar17 = uVar13 & 0xff00 | 5;
    *(ushort *)(pVVar12 + 1) = uVar17;
    uVar8 = uVar8 | uVar13 & 0xff;
    pVVar16 = &local_b8;
    goto LAB_0010e2dc;
  case tokenFalse:
    uVar8 = local_d8 & 0xfe00;
    local_d8 = uVar8 | 5;
    local_d0 = 0;
    uStack_c8 = 0;
    local_c0 = 0;
    local_e0.bool_ = false;
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar10 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar12 = &ppVVar10[-1]->value_;
    uVar13 = *(ushort *)(pVVar12 + 1);
    uVar17 = uVar13 & 0xff00 | 5;
    *(ushort *)(pVVar12 + 1) = uVar17;
    uVar8 = uVar8 | uVar13 & 0xff;
    pVVar16 = &local_e0;
LAB_0010e2dc:
    *(ushort *)(pVVar16 + 1) = uVar8;
    VVar1 = *pVVar12;
    *pVVar12 = *pVVar16;
    *pVVar16 = VVar1;
    *(ushort *)(pVVar12 + 1) = uVar17 & 0xfe05;
    *(ushort *)(pVVar16 + 1) = uVar13 & 0x100 | uVar8;
LAB_0010e304:
    VVar1 = pVVar16[4];
    VVar5 = pVVar12[3];
    VVar6 = pVVar12[4];
    pVVar12[3] = pVVar16[3];
    pVVar12[4] = VVar1;
    pVVar16[3] = VVar5;
    pVVar16[4] = VVar6;
    Value::~Value((Value *)pVVar16);
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar15 = ppVVar10;
    if (ppVVar10 == ppVVar3) {
      ppVVar15 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar4 = this->begin_;
    ppVVar15[-1]->start_ = (long)local_f8.start_ - (long)pCVar4;
    if (ppVVar10 == ppVVar3) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar10[-1]->limit_ = (long)local_f8.end_ - (long)pCVar4;
LAB_0010e36f:
    bVar7 = true;
    goto LAB_0010e371;
  case tokenNull:
    local_38 = 0;
    uStack_30 = 0;
    local_28 = 0;
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar10 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar12 = &ppVVar10[-1]->value_;
    uVar8 = *(ushort *)(pVVar12 + 1);
    *(ushort *)(pVVar12 + 1) = uVar8 & 0xff00;
    pVVar16 = &local_48;
    VVar1 = *pVVar12;
    *pVVar12 = local_48;
    local_48 = VVar1;
    *(ushort *)(pVVar12 + 1) = uVar8 & 0xfe00;
    local_40 = uVar8 & 0x100 | local_40 & 0xfe00 | uVar8 & 0xff;
    goto LAB_0010e304;
  case tokenArraySeparator:
    if ((this->features_).allowDroppedNullPlaceholders_ != true) goto switchD_0010df5b_caseD_2;
    this->current_ = this->current_ + -1;
    local_60 = 0;
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar10 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar16 = &ppVVar10[-1]->value_;
    uVar8 = *(ushort *)(pVVar16 + 1);
    *(ushort *)(pVVar16 + 1) = uVar8 & 0xff00;
    VVar1 = *pVVar16;
    *pVVar16 = local_70;
    *(ushort *)(pVVar16 + 1) = uVar8 & 0xfe00;
    local_68 = uVar8 & 0x100 | local_68 & 0xfe00 | uVar8 & 0xff;
    VStack_58 = pVVar16[3];
    local_50 = pVVar16[4];
    pVVar16[3].int_ = 0;
    pVVar16[4].int_ = 0;
    local_70 = VVar1;
    Value::~Value((Value *)&local_70);
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar15 = ppVVar10;
    if (ppVVar10 == ppVVar3) {
      ppVVar15 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar4 = this->begin_;
    pCVar2 = this->current_;
    ppVVar15[-1]->start_ = (size_t)(pCVar2 + ~(ulong)pCVar4);
    if (ppVVar10 == ppVVar3) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar10[-1]->limit_ = (long)pCVar2 - (long)pCVar4;
    goto LAB_0010e36f;
  }
  ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar10 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ppVVar10[-1]->limit_ = (long)this->current_ - (long)this->begin_;
LAB_0010e371:
  if (this->collectComments_ == true) {
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    this->lastValueEnd_ = this->current_;
    if (ppVVar10 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    this->lastValue_ = ppVVar10[-1];
  }
  return bVar7;
}

Assistant:

bool Reader::readValue() {
  Token token;
  skipCommentTokens(token);
  bool successful = true;

  if (collectComments_ && !commentsBefore_.empty()) {
    // Remove newline characters at the end of the comments
    size_t lastNonNewline = commentsBefore_.find_last_not_of("\r\n");
    if (lastNonNewline != std::string::npos) {
      commentsBefore_.erase(lastNonNewline + 1);
    } else {
      commentsBefore_.clear();
    }

    currentValue().setComment(commentsBefore_, commentBefore);
    commentsBefore_ = "";
  }

  switch (token.type_) {
  case tokenObjectBegin:
    successful = readObject(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenArrayBegin:
    successful = readArray(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenNumber:
    successful = decodeNumber(token);
    break;
  case tokenString:
    successful = decodeString(token);
    break;
  case tokenTrue:
    currentValue() = true;
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    break;
  case tokenFalse:
    currentValue() = false;
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    break;
  case tokenNull:
    currentValue() = Value();
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    break;
  case tokenArraySeparator:
    if (features_.allowDroppedNullPlaceholders_) {
      // "Un-read" the current token and mark the current value as a null
      // token.
      current_--;
      currentValue() = Value();
      currentValue().setOffsetStart(current_ - begin_ - 1);
      currentValue().setOffsetLimit(current_ - begin_);
      break;
    }
  // Else, fall through...
  default:
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    return addError("Syntax error: value, object or array expected.", token);
  }

  if (collectComments_) {
    lastValueEnd_ = current_;
    lastValue_ = &currentValue();
  }

  return successful;
}